

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd.c
# Opt level: O2

_Bool tsd_data_init_nocleanup(tsd_t *tsd)

{
  _Bool extraout_AL;
  
  duckdb_je_rtree_ctx_data_init
            (&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx);
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled = false;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level = '\x01';
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = (uint64_t)tsd;
  duckdb_je_tsd_te_init(tsd);
  duckdb_je_tsd_san_init(tsd);
  return extraout_AL;
}

Assistant:

static bool
tsd_data_init_nocleanup(tsd_t *tsd) {
	assert(tsd_state_get(tsd) == tsd_state_reincarnated ||
	    tsd_state_get(tsd) == tsd_state_minimal_initialized);
	/*
	 * During reincarnation, there is no guarantee that the cleanup function
	 * will be called (deallocation may happen after all tsd destructors).
	 * We set up tsd in a way that no cleanup is needed.
	 */
	rtree_ctx_data_init(tsd_rtree_ctxp_get_unsafe(tsd));
	*tsd_tcache_enabledp_get_unsafe(tsd) = false;
	*tsd_reentrancy_levelp_get(tsd) = 1;
	tsd_prng_state_init(tsd);
	tsd_te_init(tsd); /* event_init may use the prng state above. */
	tsd_san_init(tsd);
	assert_tsd_data_cleanup_done(tsd);

	return false;
}